

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimRadial::Write(ON_OBSOLETE_V5_DimRadial *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  bool local_21;
  bool bInChunk;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_OBSOLETE_V5_DimRadial *this_local;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (4 < iVar2) {
    local_21 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
    if (!local_21) {
      return false;
    }
  }
  else {
    local_21 = true;
  }
  if (local_21 != false) {
    bVar1 = ON_OBSOLETE_V5_Annotation::Write(&this->super_ON_OBSOLETE_V5_Annotation,archive);
    local_21 = (bool)(-bVar1 & 1);
  }
  if ((4 < iVar2) && (bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive), !bVar1)) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool ON_OBSOLETE_V5_DimRadial::Write(ON_BinaryArchive& archive) const
{
  // 18 October 2007 Dale Lear
  //    I added the chunk wrapping so V5 and future versions can
  //    add IO support for information specific to ON_OBSOLETE_V5_DimRadial
  //    V4 did not have a ON_OBSOLETE_V5_DimRadial::Write and simply called
  //    ON_OBSOLETE_V5_Annotation::Write.
  bool rc = false;
  bool bInChunk = (archive.Archive3dmVersion() >= 5);
  if ( bInChunk )
  {
    rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
    if ( !rc )
      return false;
  }
  else
  {
    rc = true;
  }

  while(rc)
  {
    rc = ON_OBSOLETE_V5_Annotation::Write(archive)?true:false;
    if (!rc) break;
    if ( !bInChunk )
      break;

    // To write new fields, increment minor version number
    // and write values here.  Ask Dale Lear for help.

    break;
  }

  if ( bInChunk )
  {
    if (!archive.EndWrite3dmChunk())
      rc = false;
  }
  return rc;
}